

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O0

int curious_register_callback
              (curious_t curious_inst,curious_callback_type_t type,curious_callback_f callback,
              void *usr_args)

{
  curious_callback_f local_40;
  curious_callback_data_t data;
  void *usr_args_local;
  curious_callback_f callback_local;
  curious_callback_type_t type_local;
  curious_t curious_inst_local;
  
  if ((type < 0) || (5 < type)) {
    type_local = 1;
  }
  else {
    local_40 = callback;
    data.callback = (curious_callback_f)usr_args;
    data.usr_args._0_4_ = curious_inst;
    data._16_8_ = usr_args;
    append_to_curious_dynamic_array(callback_registry + type,&local_40);
    type_local = 0;
  }
  return type_local;
}

Assistant:

int curious_register_callback(
    curious_t               curious_inst,
    curious_callback_type_t type,
    curious_callback_f      callback,
    void*                   usr_args
)
{
    if (0 <= type && type < CURIOUS_CALLBACK_TYPE_COUNT) {
        //we don't need to allocate space to hold the data, since it's just going to be memcpy-ed into an array
        curious_callback_data_t data;

        //initialise feilds
        data.callback     = callback;
        data.usr_args     = usr_args;
        data.curious_inst = curious_inst;

        //add record to the part of the registry corresponding to its type
        append_to_curious_dynamic_array(callback_registry + type, (void*) &data);

        return 0;
    } else {
        return CURIOUS_ERR_INVALID_CALLBACK_TYPE;
    }
}